

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Film
          (FormattingScene *this,string *type,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  ParameterDictionary *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<float,_std::allocator<float>_> s;
  vector<float,_std::allocator<float>_> m;
  string extra;
  ParameterDictionary dict;
  string *in_stack_fffffffffffffce8;
  ParameterDictionary *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffd00;
  float *in_stack_fffffffffffffd08;
  allocator<char> *args_1;
  RGBColorSpace *in_stack_fffffffffffffd10;
  int extra_00;
  FormattingScene *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_2c8 [32];
  string local_2a8 [12];
  int in_stack_fffffffffffffd64;
  ParameterDictionary *in_stack_fffffffffffffd68;
  string local_288 [36];
  float local_264;
  string local_260 [32];
  string local_240 [39];
  undefined1 local_219 [40];
  allocator<char> local_1f1;
  string local_1f0 [32];
  vector<float,_std::allocator<float>_> local_1d0;
  string local_1b8 [32];
  string local_198 [39];
  undefined1 local_171 [40];
  undefined1 local_149 [33];
  vector<float,_std::allocator<float>_> local_128;
  string local_110 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [7];
  
  this_00 = local_e0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffd00,
                  (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  ParameterDictionary::ParameterDictionary
            (in_RDX,(ParsedParameterVector *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffcf0->params);
  std::__cxx11::string::string(local_110);
  if (((in_RDI->field_2)._M_local_buf[1] & 1U) != 0) {
    in_stack_fffffffffffffd18 = (FormattingScene *)local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RDI,(allocator<char> *)in_RDX);
    ParameterDictionary::GetFloatArray
              ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
               (string *)in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string((string *)(local_149 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_149);
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd00);
    if (!bVar1) {
      in_stack_fffffffffffffd10 = (RGBColorSpace *)local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_RDI,(allocator<char> *)in_RDX);
      ParameterDictionary::RemoveFloat(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      std::__cxx11::string::~string((string *)(local_171 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_171);
      indent_abi_cxx11_(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
      std::vector<float,_std::allocator<float>_>::operator[](&local_128,0);
      StringPrintf<std::__cxx11::string,float&>
                ((char *)in_stack_fffffffffffffd18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      std::__cxx11::string::operator+=(local_110,local_198);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
    }
    args_1 = &local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RDI,(allocator<char> *)in_RDX);
    ParameterDictionary::GetFloatArray
              ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
               (string *)in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd00);
    if (!bVar1) {
      in_stack_fffffffffffffd00 =
           (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            *)local_219;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_RDI,(allocator<char> *)in_RDX);
      ParameterDictionary::RemoveFloat(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      std::__cxx11::string::~string((string *)(local_219 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_219);
      indent_abi_cxx11_(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_1d0,0);
      local_264 = *pvVar2 * 100.0;
      StringPrintf<std::__cxx11::string,float>
                ((char *)in_stack_fffffffffffffd18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd10,(float *)args_1);
      std::__cxx11::string::operator+=(local_110,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_260);
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd00);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd00);
  }
  extra_00 = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  if ((((in_RDI->field_2)._M_local_buf[1] & 1U) == 0) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8), !bVar1))
  {
    indent_abi_cxx11_(in_stack_fffffffffffffd18,extra_00);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)this_00,in_RDI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX);
    std::__cxx11::string::~string(local_2a8);
  }
  else {
    indent_abi_cxx11_(in_stack_fffffffffffffd18,extra_00);
    Printf<std::__cxx11::string>
              ((char *)in_RDX,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd18);
    std::__cxx11::string::~string(local_288);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,local_110);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd64);
  std::operator<<(poVar3,local_2c8);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_110);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x44427d);
  return;
}

Assistant:

void FormattingScene::Film(const std::string &type, ParsedParameterVector params,
                           FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        std::vector<Float> m = dict.GetFloatArray("maxsampleluminance");
        if (!m.empty()) {
            dict.RemoveFloat("maxsampleluminance");
            extra +=
                StringPrintf("%s\"float maxcomponentvalue\" [ %f ]\n", indent(1), m[0]);
        }
        std::vector<Float> s = dict.GetFloatArray("scale");
        if (!s.empty()) {
            dict.RemoveFloat("scale");
            extra += StringPrintf("%s\"float iso\" [ %f ]\n", indent(1), 100 * s[0]);
        }
    }

    if (upgrade && type == "image")
        Printf("%sFilm \"rgb\"\n", indent());
    else
        Printf("%sFilm \"%s\"\n", indent(), type);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}